

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O1

Status __thiscall
leveldb::SetCurrentFile(leveldb *this,Env *env,string *dbname,uint64_t descriptor_number)

{
  pointer pcVar1;
  undefined1 *puVar2;
  _Alloc_hider _Var3;
  _Alloc_hider __s1;
  int iVar4;
  long *plVar5;
  long *plVar6;
  ulong uVar7;
  string tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string manifest;
  string local_c8;
  long *local_a8;
  size_t local_a0;
  long local_98;
  long lStack_90;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  void *local_68;
  Slice local_60;
  string local_50;
  
  DescriptorFileName(&local_50,dbname,descriptor_number);
  __s1._M_p = local_50._M_dataplus._M_p;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  pcVar1 = (dbname->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar1,pcVar1 + dbname->_M_string_length);
  std::__cxx11::string::append((char *)&local_c8);
  _Var3._M_p = local_c8._M_dataplus._M_p;
  if (local_c8._M_string_length <= local_50._M_string_length) {
    iVar4 = bcmp(__s1._M_p,local_c8._M_dataplus._M_p,local_c8._M_string_length);
    if (iVar4 == 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var3._M_p != &local_c8.field_2) {
        operator_delete(_Var3._M_p);
      }
      uVar7 = dbname->_M_string_length + 1;
      if (uVar7 <= local_50._M_string_length) {
        TempFileName(&local_c8,dbname,descriptor_number);
        local_88[0] = local_78;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_88,__s1._M_p + uVar7,__s1._M_p + local_50._M_string_length);
        plVar5 = (long *)std::__cxx11::string::append((char *)local_88);
        plVar6 = plVar5 + 2;
        if ((long *)*plVar5 == plVar6) {
          local_98 = *plVar6;
          lStack_90 = plVar5[3];
          local_a8 = &local_98;
        }
        else {
          local_98 = *plVar6;
          local_a8 = (long *)*plVar5;
        }
        local_a0 = plVar5[1];
        *plVar5 = (long)plVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        local_60.data_ = (char *)local_a8;
        local_60.size_ = local_a0;
        WriteStringToFileSync(this,env,&local_60,&local_c8);
        if (local_a8 != &local_98) {
          operator_delete(local_a8);
        }
        if (local_88[0] != local_78) {
          operator_delete(local_88[0]);
        }
        if (*(long *)this == 0) {
          pcVar1 = (dbname->_M_dataplus)._M_p;
          local_a8 = &local_98;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a8,pcVar1,pcVar1 + dbname->_M_string_length);
          std::__cxx11::string::append((char *)&local_a8);
          (*env->_vptr_Env[0xe])(local_88,env,&local_c8,(string *)&local_a8);
          puVar2 = *(undefined1 **)this;
          *(undefined1 **)this = local_88[0];
          local_88[0] = puVar2;
          if (puVar2 != (undefined1 *)0x0) {
            operator_delete__(puVar2);
          }
          if (local_a8 != &local_98) {
            operator_delete(local_a8);
          }
        }
        if (*(long *)this != 0) {
          (*env->_vptr_Env[8])(&local_68,env,&local_c8);
          if (local_68 != (void *)0x0) {
            operator_delete__(local_68);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        return (Status)(char *)this;
      }
      __assert_fail("n <= size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/include/leveldb/slice.h"
                    ,0x45,"void leveldb::Slice::remove_prefix(size_t)");
    }
  }
  __assert_fail("contents.starts_with(dbname + \"/\")",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/filename.cc"
                ,0x80,"Status leveldb::SetCurrentFile(Env *, const std::string &, uint64_t)");
}

Assistant:

Status SetCurrentFile(Env* env, const std::string& dbname,
                      uint64_t descriptor_number) {
  // Remove leading "dbname/" and add newline to manifest file name
  std::string manifest = DescriptorFileName(dbname, descriptor_number);
  Slice contents = manifest;
  assert(contents.starts_with(dbname + "/"));
  contents.remove_prefix(dbname.size() + 1);
  std::string tmp = TempFileName(dbname, descriptor_number);
  Status s = WriteStringToFileSync(env, contents.ToString() + "\n", tmp);
  if (s.ok()) {
    s = env->RenameFile(tmp, CurrentFileName(dbname));
  }
  if (!s.ok()) {
    env->RemoveFile(tmp);
  }
  return s;
}